

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMacroCommand.cxx
# Opt level: O2

cmCommand * __thiscall cmMacroHelperCommand::Clone(cmMacroHelperCommand *this)

{
  _WordT _Var1;
  _WordT _Var2;
  _WordT _Var3;
  cmMacroHelperCommand *this_00;
  
  this_00 = (cmMacroHelperCommand *)operator_new(200);
  cmMacroHelperCommand(this_00);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this_00->Args,&this->Args);
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::operator=
            (&this_00->Functions,&this->Functions);
  std::__cxx11::string::_M_assign((string *)&this_00->FilePath);
  (this_00->Policies).Status.super__Base_bitset<5UL>._M_w[4] =
       (this->Policies).Status.super__Base_bitset<5UL>._M_w[4];
  _Var1 = (this->Policies).Status.super__Base_bitset<5UL>._M_w[0];
  _Var2 = (this->Policies).Status.super__Base_bitset<5UL>._M_w[1];
  _Var3 = (this->Policies).Status.super__Base_bitset<5UL>._M_w[3];
  (this_00->Policies).Status.super__Base_bitset<5UL>._M_w[2] =
       (this->Policies).Status.super__Base_bitset<5UL>._M_w[2];
  (this_00->Policies).Status.super__Base_bitset<5UL>._M_w[3] = _Var3;
  (this_00->Policies).Status.super__Base_bitset<5UL>._M_w[0] = _Var1;
  (this_00->Policies).Status.super__Base_bitset<5UL>._M_w[1] = _Var2;
  return &this_00->super_cmCommand;
}

Assistant:

virtual cmCommand* Clone()
  {
    cmMacroHelperCommand *newC = new cmMacroHelperCommand;
    // we must copy when we clone
    newC->Args = this->Args;
    newC->Functions = this->Functions;
    newC->FilePath = this->FilePath;
    newC->Policies = this->Policies;
    return newC;
  }